

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O2

void __thiscall
dg::pta::PointerAnalysisFI::getMemoryObjects
          (PointerAnalysisFI *this,PSNode *where,Pointer *pointer,
          vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_> *objects)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  PSNode *pPVar3;
  Pointer PVar4;
  MemoryObject *mo;
  
  pPVar3 = pointer->target;
  iVar2 = *(int *)(pPVar3 + 0x90);
  if (iVar2 != 4) {
    if (iVar2 == 0x12) {
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::begin((const_iterator *)&mo,
              (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
               *)(pPVar3 + 0xb0));
      PVar4 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&mo);
      pPVar3 = PVar4.target;
      goto LAB_00121905;
    }
    if (iVar2 != 6) goto LAB_00121905;
  }
  pPVar3 = (PSNode *)**(undefined8 **)(pPVar3 + 0x58);
LAB_00121905:
  if (*(int *)(pPVar3 + 0x90) != 7) {
    mo = *(MemoryObject **)(pPVar3 + 0x10);
    if (mo == (MemoryObject *)0x0) {
      mo = (MemoryObject *)operator_new(0x38);
      mo->node = pPVar3;
      p_Var1 = &(mo->pointsTo)._M_t._M_impl.super__Rb_tree_header;
      (mo->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (mo->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (mo->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (mo->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (mo->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::
      vector<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::allocator<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>
      ::emplace_back<dg::pta::MemoryObject*&>
                ((vector<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::allocator<std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>
                  *)&this->memory_objects,&mo);
      *(MemoryObject **)(pPVar3 + 0x10) = mo;
    }
    std::vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_>::push_back
              (objects,&mo);
  }
  return;
}

Assistant:

void getMemoryObjects(PSNode *where, const Pointer &pointer,
                          std::vector<MemoryObject *> &objects) override {
        // irrelevant in flow-insensitive
        (void) where;
        PSNode *n = pointer.target;

        // we want to have memory in allocation sites
        if (n->getType() == PSNodeType::CAST || n->getType() == PSNodeType::GEP)
            n = n->getOperand(0);
        else if (n->getType() == PSNodeType::CONSTANT) {
            assert(n->pointsTo.size() == 1);
            n = (*n->pointsTo.begin()).target;
        }

        if (n->getType() == PSNodeType::FUNCTION)
            return;

        assert(n->getType() == PSNodeType::ALLOC ||
               n->getType() == PSNodeType::UNKNOWN_MEM);

        MemoryObject *mo = n->getData<MemoryObject>();
        if (!mo) {
            mo = new MemoryObject(n);
            memory_objects.emplace_back(mo);
            n->setData<MemoryObject>(mo);
        }

        objects.push_back(mo);
    }